

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O0

void SN_UpdateActiveSequences(void)

{
  DSeqNode *local_10;
  DSeqNode *node;
  
  if ((ActiveSequences != 0) && (paused == 0)) {
    for (local_10 = DSeqNode::FirstSequence(); local_10 != (DSeqNode *)0x0;
        local_10 = DSeqNode::NextSequence(local_10)) {
      DSeqNode::Tick(local_10);
    }
  }
  return;
}

Assistant:

void SN_UpdateActiveSequences (void)
{
	DSeqNode *node;

	if (!ActiveSequences || paused)
	{ // No sequences currently playing/game is paused
		return;
	}
	for (node = DSeqNode::FirstSequence(); node; node = node->NextSequence())
	{
		node->Tick ();
	}
}